

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkP2PClientTest.cpp
# Opt level: O1

void __thiscall
MyP2PClientConnection::OnData
          (MyP2PClientConnection *this,uint32_t channel,uint8_t *data,uint32_t bytes)

{
  ostringstream *poVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  uint32_t uVar5;
  OutputWorker *pOVar6;
  uint64_t uVar7;
  uint64_t uVar8;
  uint64_t uVar9;
  undefined1 local_1b8 [392];
  
  if (bytes != 0) {
    if (*data == '\b') {
      if ((channel != 0x98) && ((int)Logger.ChannelMinLevel < 5)) {
        poVar1 = (ostringstream *)(local_1b8 + 0x10);
        local_1b8._0_8_ = Logger.ChannelName;
        local_1b8._8_4_ = Error;
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,Logger.Prefix._M_dataplus._M_p,Logger.Prefix._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,"Corrupted data: Wrong channel",0x1d);
        pOVar6 = logger::OutputWorker::GetInstance();
        logger::OutputWorker::Write(pOVar6,(LogStringBuffer *)local_1b8);
        std::__cxx11::ostringstream::~ostringstream(poVar1);
        std::ios_base::~ios_base((ios_base *)(local_1b8 + 0x80));
      }
      if ((bytes != 0x578) && ((int)Logger.ChannelMinLevel < 5)) {
        poVar1 = (ostringstream *)(local_1b8 + 0x10);
        local_1b8._0_8_ = Logger.ChannelName;
        local_1b8._8_4_ = Error;
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,Logger.Prefix._M_dataplus._M_p,Logger.Prefix._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,"Corrupted data: Wrong size",0x1a);
        pOVar6 = logger::OutputWorker::GetInstance();
        logger::OutputWorker::Write(pOVar6,(LogStringBuffer *)local_1b8);
        std::__cxx11::ostringstream::~ostringstream(poVar1);
        std::ios_base::~ios_base((ios_base *)(local_1b8 + 0x80));
      }
      bVar2 = data[5];
      bVar3 = data[4];
      bVar4 = data[3];
      uVar7 = tonk::SDKConnection::FromLocalTime16
                        (&this->super_SDKConnection,*(uint16_t *)(data + 1));
      uVar8 = tonk::SDKConnection::FromLocalTime23
                        (&this->super_SDKConnection,
                         (uint)bVar4 | (uint)bVar3 << 8 | (uint)bVar2 << 0x10);
      if ((((uint)data[6] | (uint)data[7] << 8 | (uint)data[8] << 0x10) != 0xadd12d) &&
         ((int)Logger.ChannelMinLevel < 5)) {
        poVar1 = (ostringstream *)(local_1b8 + 0x10);
        local_1b8._0_8_ = Logger.ChannelName;
        local_1b8._8_4_ = Error;
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,Logger.Prefix._M_dataplus._M_p,Logger.Prefix._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,"Corrupted data: Bad magic",0x19);
        pOVar6 = logger::OutputWorker::GetInstance();
        logger::OutputWorker::Write(pOVar6,(LogStringBuffer *)local_1b8);
        std::__cxx11::ostringstream::~ostringstream(poVar1);
        std::ios_base::~ios_base((ios_base *)(local_1b8 + 0x80));
      }
      uVar5 = *(uint32_t *)(data + 9);
      if ((this->NextPacketIndex != uVar5) && ((int)Logger.ChannelMinLevel < 5)) {
        poVar1 = (ostringstream *)(local_1b8 + 0x10);
        local_1b8._0_8_ = Logger.ChannelName;
        local_1b8._8_4_ = Error;
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,Logger.Prefix._M_dataplus._M_p,Logger.Prefix._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,"Corrupted data: Incorrect packet id",0x23);
        pOVar6 = logger::OutputWorker::GetInstance();
        logger::OutputWorker::Write(pOVar6,(LogStringBuffer *)local_1b8);
        std::__cxx11::ostringstream::~ostringstream(poVar1);
        std::ios_base::~ios_base((ios_base *)(local_1b8 + 0x80));
      }
      this->NextPacketIndex = uVar5 + 1;
      tonk::SDKConnection::GetStatus((TonkStatus *)local_1b8,&this->super_SDKConnection);
      if ((local_1b8._0_8_ & 1) != 0) {
        uVar9 = tonk_time();
        test::OWDTimeStatistics::AddSample(&this->OWDStats,uVar9 - uVar8);
        if (1999999 < uVar9 - this->LastStatsUsec) {
          this->LastStatsUsec = uVar9;
          if ((int)Logger.ChannelMinLevel < 3) {
            poVar1 = (ostringstream *)(local_1b8 + 0x10);
            local_1b8._0_8_ = Logger.ChannelName;
            local_1b8._8_4_ = Info;
            std::__cxx11::ostringstream::ostringstream(poVar1);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar1,Logger.Prefix._M_dataplus._M_p,
                       Logger.Prefix._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar1,"DATA RESULT: Transmission time (acc=16) = ",0x2a);
            std::ostream::operator<<((ostream *)poVar1,(int)uVar9 - (int)uVar7);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)poVar1,", (acc=23) = ",0xd);
            std::ostream::operator<<((ostream *)poVar1,(int)(uVar9 - uVar8));
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," # ",3);
            std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
            pOVar6 = logger::OutputWorker::GetInstance();
            logger::OutputWorker::Write(pOVar6,(LogStringBuffer *)local_1b8);
            std::__cxx11::ostringstream::~ostringstream(poVar1);
            std::ios_base::~ios_base((ios_base *)(local_1b8 + 0x80));
          }
          test::OWDTimeStatistics::PrintStatistics(&this->OWDStats);
        }
      }
    }
    else if (*data == '\a') {
      if ((channel != 0x98) && ((int)Logger.ChannelMinLevel < 5)) {
        poVar1 = (ostringstream *)(local_1b8 + 0x10);
        local_1b8._0_8_ = Logger.ChannelName;
        local_1b8._8_4_ = Error;
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,Logger.Prefix._M_dataplus._M_p,Logger.Prefix._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,"Corrupted data: Wrong channel",0x1d);
        pOVar6 = logger::OutputWorker::GetInstance();
        logger::OutputWorker::Write(pOVar6,(LogStringBuffer *)local_1b8);
        std::__cxx11::ostringstream::~ostringstream(poVar1);
        std::ios_base::~ios_base((ios_base *)(local_1b8 + 0x80));
      }
      if ((bytes != 0x578) && ((int)Logger.ChannelMinLevel < 5)) {
        poVar1 = (ostringstream *)(local_1b8 + 0x10);
        local_1b8._0_8_ = Logger.ChannelName;
        local_1b8._8_4_ = Error;
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,Logger.Prefix._M_dataplus._M_p,Logger.Prefix._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,"Corrupted data: Wrong size",0x1a);
        pOVar6 = logger::OutputWorker::GetInstance();
        logger::OutputWorker::Write(pOVar6,(LogStringBuffer *)local_1b8);
        std::__cxx11::ostringstream::~ostringstream(poVar1);
        std::ios_base::~ios_base((ios_base *)(local_1b8 + 0x80));
      }
      if ((((uint)data[6] | (uint)data[7] << 8 | (uint)data[8] << 0x10) != 0xadd12d) &&
         ((int)Logger.ChannelMinLevel < 5)) {
        poVar1 = (ostringstream *)(local_1b8 + 0x10);
        local_1b8._0_8_ = Logger.ChannelName;
        local_1b8._8_4_ = Error;
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,Logger.Prefix._M_dataplus._M_p,Logger.Prefix._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,"Corrupted data: Bad magic",0x19);
        pOVar6 = logger::OutputWorker::GetInstance();
        logger::OutputWorker::Write(pOVar6,(LogStringBuffer *)local_1b8);
        std::__cxx11::ostringstream::~ostringstream(poVar1);
        std::ios_base::~ios_base((ios_base *)(local_1b8 + 0x80));
      }
      uVar5 = *(uint32_t *)(data + 9);
      if ((this->NextPacketIndex != uVar5) && ((int)Logger.ChannelMinLevel < 5)) {
        poVar1 = (ostringstream *)(local_1b8 + 0x10);
        local_1b8._0_8_ = Logger.ChannelName;
        local_1b8._8_4_ = Error;
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,Logger.Prefix._M_dataplus._M_p,Logger.Prefix._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,"Corrupted data: Incorrect packet id",0x23);
        pOVar6 = logger::OutputWorker::GetInstance();
        logger::OutputWorker::Write(pOVar6,(LogStringBuffer *)local_1b8);
        std::__cxx11::ostringstream::~ostringstream(poVar1);
        std::ios_base::~ios_base((ios_base *)(local_1b8 + 0x80));
      }
      this->NextPacketIndex = uVar5 + 1;
    }
    else if ((int)Logger.ChannelMinLevel < 5) {
      poVar1 = (ostringstream *)(local_1b8 + 0x10);
      local_1b8._0_8_ = Logger.ChannelName;
      local_1b8._8_4_ = Error;
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,Logger.Prefix._M_dataplus._M_p,Logger.Prefix._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"Peer: Got ",10);
      std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1," bytes of message data",0x16);
      pOVar6 = logger::OutputWorker::GetInstance();
      logger::OutputWorker::Write(pOVar6,(LogStringBuffer *)local_1b8);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      std::ios_base::~ios_base((ios_base *)(local_1b8 + 0x80));
    }
  }
  return;
}

Assistant:

void MyP2PClientConnection::OnData(
    uint32_t          channel,  // Channel number attached to each message by sender
    const uint8_t*       data,  // Pointer to a buffer containing the message data
    uint32_t            bytes   // Number of bytes in the message
)
{
    if (bytes <= 0)
        return;

    if (bytes > 0)
    {
        if (data[0] == ID_LowPriBulkData_NoTimestamp)
        {
            TONK_CPP_SDK_DEBUG_ASSERT(channel == kLowPriBulkData_Channel);
            if (channel != kLowPriBulkData_Channel) {
                Logger.Error("Corrupted data: Wrong channel");
            }
            TONK_CPP_SDK_DEBUG_ASSERT(bytes == kLowPriBulkData_Bytes);
            if (bytes != kLowPriBulkData_Bytes) {
                Logger.Error("Corrupted data: Wrong size");
            }
            uint32_t magic = tonk::ReadU24_LE(data + 1 + 2 + 3);
            if (magic != kLowPriBulkMagic) {
                Logger.Error("Corrupted data: Bad magic");
            }
            TONK_CPP_SDK_DEBUG_ASSERT(magic == kLowPriBulkMagic);
            uint32_t packetIndex = tonk::ReadU32_LE(data + 1 + 2 + 3 + 3);
            TONK_CPP_SDK_DEBUG_ASSERT(NextPacketIndex == packetIndex);
            if (NextPacketIndex != packetIndex) {
                Logger.Error("Corrupted data: Incorrect packet id");
            }
            NextPacketIndex = packetIndex + 1;
            for (unsigned i = 1 + 2 + 3 + 3 + 4; i < bytes; ++i) {
                TONK_CPP_SDK_DEBUG_ASSERT(data[i] == (uint8_t)i);
            }

            return;
        }

        if (data[0] == ID_LowPriBulkData_HasTimestamp)
        {
            TONK_CPP_SDK_DEBUG_ASSERT(channel == kLowPriBulkData_Channel);
            if (channel != kLowPriBulkData_Channel) {
                Logger.Error("Corrupted data: Wrong channel");
            }
            TONK_CPP_SDK_DEBUG_ASSERT(bytes == kLowPriBulkData_Bytes);
            if (bytes != kLowPriBulkData_Bytes) {
                Logger.Error("Corrupted data: Wrong size");
            }
            uint16_t ts16 = tonk::ReadU16_LE(data + 1);
            uint32_t ts23 = tonk::ReadU24_LE(data + 1 + 2);
            uint64_t lo16 = FromLocalTime16(ts16);
            uint64_t lo23 = FromLocalTime23(ts23);
            uint32_t magic = tonk::ReadU24_LE(data + 1 + 2 + 3);
            if (magic != kLowPriBulkMagic) {
                Logger.Error("Corrupted data: Bad magic");
            }
            TONK_CPP_SDK_DEBUG_ASSERT(magic == kLowPriBulkMagic);
            uint32_t packetIndex = tonk::ReadU32_LE(data + 1 + 2 + 3 + 3);
            TONK_CPP_SDK_DEBUG_ASSERT(NextPacketIndex == packetIndex);
            if (NextPacketIndex != packetIndex) {
                Logger.Error("Corrupted data: Incorrect packet id");
            }
            NextPacketIndex = packetIndex + 1;
            for (unsigned i = 1 + 2 + 3 + 3 + 4; i < bytes; ++i) {
                TONK_CPP_SDK_DEBUG_ASSERT(data[i] == (uint8_t)i);
            }

            if (0 != (GetStatus().Flags & TonkFlag_TimeSync))
            {
                uint64_t nowUsec = tonk_time();
                uint64_t owdUsec = nowUsec - lo23;
                OWDStats.AddSample(owdUsec);

                if (nowUsec - LastStatsUsec >= kStatsReportIntervalUsec)
                {
                    LastStatsUsec = nowUsec;
#ifdef ENABLE_P2P_DATA_RESULT
                    Logger.Info("DATA RESULT: Transmission time (acc=16) = ", (int)(nowUsec - lo16), ", (acc=23) = ", (int)(nowUsec - lo23), " # ", packetIndex);
                    OWDStats.PrintStatistics();
#endif
                }
            }

            return;
        }
    }

    Logger.Error("Peer: Got ", bytes, " bytes of message data");
    TONK_CPP_SDK_DEBUG_BREAK();
}